

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::IsChrpathUsed(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  LinkClosure *pLVar7;
  char *pcVar8;
  bool bVar9;
  string ll;
  string sepVar;
  string local_88;
  string local_68;
  string local_48;
  
  TVar5 = cmTarget::GetType(this->Target);
  if ((((TVar5 != SHARED_LIBRARY) &&
       (TVar5 = cmTarget::GetType(this->Target), TVar5 != MODULE_LIBRARY)) &&
      (TVar5 = cmTarget::GetType(this->Target), TVar5 != EXECUTABLE)) ||
     (bVar4 = cmTarget::GetHaveInstallRule(this->Target), !bVar4)) {
    return false;
  }
  pcVar2 = this->Makefile;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_SKIP_RPATH","");
  bVar4 = cmMakefile::IsOn(pcVar2,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    return false;
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"BUILD_WITH_INSTALL_RPATH","")
  ;
  bVar4 = cmTarget::GetPropertyAsBool(this->Target,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    return false;
  }
  pcVar2 = this->Makefile;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_NO_BUILTIN_CHRPATH","")
  ;
  bVar4 = cmMakefile::IsOn(pcVar2,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    return false;
  }
  pcVar2 = this->Makefile;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar4 = cmMakefile::IsOn(pcVar2,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  bVar9 = true;
  if (bVar4) {
    return true;
  }
  pLVar7 = GetLinkClosure(this,config);
  pcVar3 = (pLVar7->LinkerLanguage)._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + (pLVar7->LinkerLanguage)._M_string_length);
  if (local_88._M_string_length != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"CMAKE_SHARED_LIBRARY_RUNTIME_","");
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_68);
    pcVar8 = cmMakefile::GetDefinition(this->Makefile,&local_68);
    bVar4 = true;
    if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
      pcVar2 = this->Makefile;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"CMAKE_EXECUTABLE_FORMAT","");
      pcVar8 = cmMakefile::GetDefinition(pcVar2,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      bVar4 = pcVar8 == (char *)0x0;
      if (!bVar4) {
        iVar6 = strcmp(pcVar8,"ELF");
        bVar9 = iVar6 == 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) goto LAB_003a35fc;
  }
  bVar9 = false;
LAB_003a35fc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    return bVar9;
  }
  return bVar9;
}

Assistant:

bool cmGeneratorTarget::IsChrpathUsed(const std::string& config) const
{
  // Only certain target types have an rpath.
  if (!(this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->GetType() == cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // If the target will not be installed we do not need to change its
  // rpath.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // Skip chrpath if skipping rpath altogether.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // Skip chrpath if it does not need to be changed at install time.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // Allow the user to disable builtin chrpath explicitly.
  if (this->Makefile->IsOn("CMAKE_NO_BUILTIN_CHRPATH")) {
    return false;
  }

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return true;
  }

#if defined(CMAKE_USE_ELF_PARSER)
  // Enable if the rpath flag uses a separator and the target uses ELF
  // binaries.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string sepVar = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    sepVar += ll;
    sepVar += "_FLAG_SEP";
    const char* sep = this->Makefile->GetDefinition(sepVar);
    if (sep && *sep) {
      // TODO: Add ELF check to ABI detection and get rid of
      // CMAKE_EXECUTABLE_FORMAT.
      if (const char* fmt =
            this->Makefile->GetDefinition("CMAKE_EXECUTABLE_FORMAT")) {
        return strcmp(fmt, "ELF") == 0;
      }
    }
  }
#endif
  static_cast<void>(config);
  return false;
}